

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimRelCheckFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts,Vec_Wrd_t *vFuncs)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int Values [32];
  uint auStack_b8 [34];
  
  uVar6 = 1 << ((byte)nOuts & 0x1f);
  uVar5 = (long)vRel->nSize / (long)(int)uVar6;
  iVar3 = (int)uVar5;
  if (vFuncs->nSize != nOuts * iVar3 * 2) {
    __assert_fail("Vec_WrdSize(vFuncs) == 2 * nOuts * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f4,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f5,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (0 < iVar3) {
    iVar2 = iVar3 * 0x40;
    if ((int)uVar6 < 2) {
      uVar6 = 1;
    }
    uVar5 = uVar5 & 0xffffffff;
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    uVar12 = 0;
    iVar4 = 0;
    do {
      if (nOuts < 1) {
LAB_007c477c:
        uVar7 = 0;
        do {
          uVar14 = (uint)uVar7;
          if (0 < nOuts) {
            uVar11 = 0;
            do {
              if ((auStack_b8[uVar11] >> ((uVar14 >> ((uint)uVar11 & 0x1f) & 1) != 0) & 1) == 0)
              goto LAB_007c47f5;
              uVar11 = uVar11 + 1;
            } while ((uint)nOuts != uVar11);
          }
          uVar8 = uVar14 + ((int)uVar12 << ((byte)nOuts & 0x1f));
          if ((vRel->pArray[(int)uVar8 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
            if (iVar4 == 0) {
              printf("For pattern %d, minterm %d produced by function is not in the relation.\n",
                     uVar12 & 0xffffffff,uVar7);
              iVar4 = 1;
            }
            else {
              iVar4 = iVar4 + 1;
            }
          }
LAB_007c47f5:
          uVar7 = (ulong)(uVar14 + 1);
        } while (uVar14 + 1 != uVar6);
      }
      else {
        bVar1 = (byte)uVar12 & 0x3f;
        uVar7 = 0;
        lVar9 = 0;
        do {
          if ((int)lVar9 < 0) {
LAB_007c484b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          lVar10 = uVar5 * 2 + lVar9;
          if (vFuncs->nSize <= (int)lVar10 + iVar3 * -2) goto LAB_007c484b;
          uVar11 = vFuncs->pArray[(uVar12 >> 6) + lVar9] >> bVar1;
          if (((int)(uVar5 + lVar9) < 0) || ((ulong)(uint)vFuncs->nSize <= uVar5 + lVar9))
          goto LAB_007c484b;
          uVar13 = vFuncs->pArray[(uVar12 >> 6) + uVar5 + lVar9] & 1L << bVar1;
          if (((((uVar11 & 1) == 0) || (uVar14 = 1, uVar13 != 0)) &&
              (((uVar11 & 1) != 0 || (uVar14 = 2, uVar13 == 0)))) &&
             (((uVar11 & 1) != 0 || (uVar14 = 3, uVar13 != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                          ,0x302,
                          "void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)"
                         );
          }
          auStack_b8[uVar7] = uVar14;
          uVar7 = uVar7 + 1;
          lVar9 = lVar10;
        } while ((uint)nOuts != uVar7);
        if (nOuts != 0x1f) goto LAB_007c477c;
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 != iVar2);
    if (iVar4 != 0) {
      printf("Total number of similar errors = %d.\n");
      return;
    }
  }
  puts("The function agrees with the relation.");
  return;
}

Assistant:

void Gia_ManSimRelCheckFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts, Vec_Wrd_t * vFuncs )
{
    int i, k, m, Values[32], nErrors = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    assert( Vec_WrdSize(vFuncs) == 2 * nOuts * nWords );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( k = 0; k < nOuts; k++ )
        {
            int Value0 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
            int Value1 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            if ( Value0 && !Value1 )
                Values[k] = 1;
            else if ( !Value0 && Value1 )
                Values[k] = 2;
            else if ( !Value0 && !Value1 )
                Values[k] = 3;
            else assert( 0 );
        }
        for ( m = 0; m < nMints; m++ )
        {
            for ( k = 0; k < nOuts; k++ )
                if ( ((Values[k] >> ((m >> k) & 1)) & 1) == 0 )
                    break;
            if ( k < nOuts )
                continue;
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                continue;
            if ( nErrors++ == 0 )
                printf( "For pattern %d, minterm %d produced by function is not in the relation.\n", i, m );
        }
    }
    if ( nErrors )    
        printf( "Total number of similar errors = %d.\n", nErrors );
    else
        printf( "The function agrees with the relation.\n" );
}